

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

UBool __thiscall icu_63::OrConstraint::isFulfilled(OrConstraint *this,IFixedDecimal *number)

{
  UBool UVar1;
  AndConstraint *this_00;
  
  do {
    this_00 = this->childNode;
    if (this_00 == (AndConstraint *)0x0) {
      UVar1 = '\x01';
    }
    else {
      do {
        UVar1 = AndConstraint::isFulfilled(this_00,number);
        if (UVar1 == '\0') break;
        this_00 = this_00->next;
      } while (this_00 != (AndConstraint *)0x0);
    }
    this = this->next;
    if ((this == (OrConstraint *)0x0) || (UVar1 != '\0')) {
      return UVar1;
    }
  } while( true );
}

Assistant:

UBool
OrConstraint::isFulfilled(const IFixedDecimal &number) {
    OrConstraint* orRule=this;
    UBool result=FALSE;

    while (orRule!=nullptr && !result) {
        result=TRUE;
        AndConstraint* andRule = orRule->childNode;
        while (andRule!=nullptr && result) {
            result = andRule->isFulfilled(number);
            andRule=andRule->next;
        }
        orRule = orRule->next;
    }

    return result;
}